

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_QueueSetVolume(FAudioVoice *voice,float Volume,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  undefined8 in_RDI;
  uint32_t in_XMM0_Da;
  FAudio_OPERATIONSET_Operation *op;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x1352e4);
  pFVar1 = QueueOperation((FAudioVoice *)op,(FAudio_OPERATIONSET_Type)((ulong)in_RDI >> 0x20),
                          (uint32_t)in_RDI);
  (pFVar1->Data).EnableEffect.EffectIndex = in_XMM0_Da;
  FAudio_PlatformUnlockMutex((FAudioMutex)0x13531b);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetVolume(
	FAudioVoice *voice,
	float Volume,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETVOLUME,
		OperationSet
	);

	op->Data.SetVolume.Volume = Volume;

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}